

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CircularBuffer.cpp
# Opt level: O1

int __thiscall
JetHead::CircularBuffer::waitForFreeSpace(CircularBuffer *this,int threshold,uint32_t msecs)

{
  undefined1 auVar1 [16];
  bool bVar2;
  uint32_t timeoutms;
  int iVar3;
  timeval tv_1;
  AutoLock lock;
  timeval local_58;
  AutoLock local_48;
  
  gettimeofday((timeval *)&local_48,(__timezone_ptr_t)0x0);
  AutoLock::AutoLock(&local_48,&this->mLock);
  if ((int)(this->mBufferSize - this->mLen) < threshold) {
    timeoutms = msecs;
    do {
      bVar2 = Condition::Wait(&this->mFreeCondition,&this->mLock,timeoutms);
      if (!bVar2) break;
      gettimeofday(&local_58,(__timezone_ptr_t)0x0);
      auVar1 = SEXT816((local_58.tv_usec - (long)local_48.mFile) * 1000) *
               SEXT816(0x431bde82d7b634db);
      timeoutms = msecs - (((int)local_58.tv_sec - (int)local_48.mMutex) * 1000 +
                          ((int)(auVar1._8_8_ >> 0x12) - (auVar1._12_4_ >> 0x1f)));
    } while ((int)(this->mBufferSize - this->mLen) < threshold);
  }
  iVar3 = this->mBufferSize - this->mLen;
  if (iVar3 < threshold) {
    iVar3 = 0;
  }
  AutoLock::~AutoLock(&local_48);
  return iVar3;
}

Assistant:

int CircularBuffer::waitForFreeSpace( int threshold, uint32_t msecs )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	
	uint32_t timeout = msecs;	
	struct timespec start, cur;
	TimeUtils::getCurTime( &start );
	
	LOG( "Wating for data %d cur size %d timeout %d", threshold, length_internal(), msecs );

	AutoLock lock( mLock );
	
	if ( mBufferSize - length_internal() < threshold )
		LOG_INFO( "buffer underflow" );
	
	while ( mBufferSize - length_internal() < threshold && mFreeCondition.Wait( mLock, timeout ) )
	{
		TimeUtils::getCurTime( &cur );
		timeout = msecs - TimeUtils::getDifference( &cur, &start );
		
		LOG( "Wating for data %d cur size %d msecs remaining %d", threshold, length_internal(), timeout );
	}

	if ( mBufferSize - length_internal() >= threshold )
		return mBufferSize - length_internal();
	else
		return 0;
}